

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O2

t_int * times_perform(t_int *w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  t_int tVar4;
  long lVar5;
  
  lVar1 = w[1];
  lVar2 = w[2];
  lVar3 = w[3];
  tVar4 = w[4];
  for (lVar5 = 0; (int)tVar4 != (int)lVar5; lVar5 = lVar5 + 1) {
    *(float *)(lVar3 + lVar5 * 4) = *(float *)(lVar1 + lVar5 * 4) * *(float *)(lVar2 + lVar5 * 4);
  }
  return w + 5;
}

Assistant:

t_int *times_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--) *out++ = *in1++ * *in2++;
    return (w+5);
}